

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeaderStructs.cpp
# Opt level: O1

size_t __thiscall TxaHeader::updateAndCalcBinSize(TxaHeader *this)

{
  bool bVar1;
  pointer pTVar2;
  TxaChunk *chunk;
  pointer pTVar3;
  string local_50;
  
  bVar1 = this->isSwitch;
  this->largestDecodedChunk = 0;
  this->indexSize = 0;
  pTVar3 = (this->chunks).super__Vector_base<TxaChunk,_std::allocator<TxaChunk>_>._M_impl.
           super__Vector_impl_data._M_start;
  pTVar2 = (this->chunks).super__Vector_base<TxaChunk,_std::allocator<TxaChunk>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pTVar3 != pTVar2) {
    do {
      this->indexSize = this->indexSize + (uint)bVar1 * 4 + 0x10;
      iconv_convert_abi_cxx11_
                (&local_50,(pTVar3->name)._M_dataplus._M_p,(pTVar3->name)._M_string_length,
                 iconv_fromutf);
      this->indexSize = ((uint)local_50._M_string_length & 0xfffffffc) + this->indexSize + 4;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      if (this->largestDecodedChunk < pTVar3->decodedLength) {
        this->largestDecodedChunk = pTVar3->decodedLength;
      }
      pTVar3 = pTVar3 + 1;
    } while (pTVar3 != pTVar2);
  }
  return (ulong)this->indexSize + 0x20;
}

Assistant:

size_t TxaHeader::updateAndCalcBinSize() {
	size_t size = isSwitch ? sizeof(TxaHeaderSwitch) : sizeof(TxaHeaderPS3);
	size_t chunksize = isSwitch ? sizeof(TxaChunkSwitch) : sizeof(TxaChunkPS3);
	indexSize = 0;
	largestDecodedChunk = 0;

	for (const auto& chunk : chunks) {
		indexSize += chunksize;
		indexSize += align(fromUTF8(chunk.name).size() + 1, 4);
		if (chunk.decodedLength > largestDecodedChunk) {
			largestDecodedChunk = chunk.decodedLength;
		}
	}

	return size + indexSize;
}